

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O2

size_t MuxImageDiskSize(WebPMuxImage *wpi)

{
  size_t sVar1;
  size_t sVar2;
  
  if (wpi->header_ == (WebPChunk *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = (ulong)((int)(wpi->header_->data_).size + 1U & 0xfffffffe) + 8;
  }
  if (wpi->alpha_ != (WebPChunk *)0x0) {
    sVar2 = sVar2 + ((int)(wpi->alpha_->data_).size + 1U & 0xfffffffe) + 8;
  }
  if (wpi->img_ != (WebPChunk *)0x0) {
    sVar2 = sVar2 + ((int)(wpi->img_->data_).size + 1U & 0xfffffffe) + 8;
  }
  if (wpi->unknown_ != (WebPChunk *)0x0) {
    sVar1 = ChunkListDiskSize(wpi->unknown_);
    sVar2 = sVar2 + sVar1;
  }
  return sVar2;
}

Assistant:

size_t MuxImageDiskSize(const WebPMuxImage* const wpi) {
  size_t size = 0;
  if (wpi->header_ != NULL) size += ChunkDiskSize(wpi->header_);
  if (wpi->alpha_ != NULL) size += ChunkDiskSize(wpi->alpha_);
  if (wpi->img_ != NULL) size += ChunkDiskSize(wpi->img_);
  if (wpi->unknown_ != NULL) size += ChunkListDiskSize(wpi->unknown_);
  return size;
}